

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

int FindMaxBits_TargetCollisionNb(int nbHashes,int minCollisions)

{
  int in_ESI;
  double dVar1;
  double nbColls;
  int nb;
  int local_10;
  
  local_10 = 0x3f;
  while ((2 < local_10 &&
         (dVar1 = EstimateNbCollisions(nbColls._4_4_,nbColls._0_4_), dVar1 <= (double)in_ESI))) {
    local_10 = local_10 + -1;
  }
  return local_10;
}

Assistant:

static int FindMaxBits_TargetCollisionNb(int nbHashes, int minCollisions)
{
    int nb;
    for (nb=63; nb>2; nb--) {
        double const nbColls = EstimateNbCollisions(nbHashes, nb);
        if (nbColls > minCollisions) return nb;
    }
    assert(0);
    return nb;
}